

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

bool __thiscall dgPolyhedra::FlipEdge(dgPolyhedra *this,dgEdge *edge)

{
  int iVar1;
  int iVar2;
  HaI32 HVar3;
  dgEdge *pdVar4;
  dgEdge *pdVar5;
  dgEdge *pdVar6;
  dgTreeNode *pdVar7;
  
  if (((edge->m_next->m_next->m_next == edge) &&
      (pdVar6 = edge->m_twin, pdVar6->m_next->m_next->m_next == pdVar6)) &&
     (pdVar6 = FindEdge(this,edge->m_prev->m_incidentVertex,pdVar6->m_prev->m_incidentVertex),
     pdVar6 == (dgEdge *)0x0)) {
    pdVar6 = edge->m_prev;
    pdVar4 = edge->m_twin->m_prev;
    iVar1 = pdVar6->m_incidentVertex;
    iVar2 = pdVar4->m_incidentVertex;
    pdVar7 = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,edge);
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,pdVar7,(long)iVar2 << 0x20 | (long)iVar1);
    pdVar7 = dgTree<dgEdge,_long>::GetNodeFromInfo(&this->super_dgTree<dgEdge,_long>,edge->m_twin);
    dgTree<dgEdge,_long>::ReplaceKey
              (&this->super_dgTree<dgEdge,_long>,pdVar7,(long)iVar1 << 0x20 | (long)iVar2);
    edge->m_incidentVertex = pdVar4->m_incidentVertex;
    pdVar5 = edge->m_twin;
    pdVar5->m_incidentVertex = pdVar6->m_incidentVertex;
    edge->m_userData = pdVar4->m_userData;
    pdVar5->m_userData = pdVar6->m_userData;
    pdVar6->m_next = pdVar5->m_next;
    pdVar4->m_prev->m_prev = edge->m_prev;
    pdVar4->m_next = edge->m_next;
    pdVar6->m_prev->m_prev = pdVar5->m_prev;
    edge->m_prev = pdVar4->m_prev;
    edge->m_next = pdVar6;
    pdVar5->m_prev = pdVar6->m_prev;
    pdVar5->m_next = pdVar4;
    pdVar4->m_prev->m_next = edge;
    pdVar4->m_prev = pdVar5;
    pdVar6->m_prev->m_next = pdVar5;
    pdVar6->m_prev = edge;
    HVar3 = edge->m_incidentFace;
    edge->m_next->m_incidentFace = HVar3;
    edge->m_prev->m_incidentFace = HVar3;
    HVar3 = pdVar5->m_incidentFace;
    pdVar5->m_next->m_incidentFace = HVar3;
    pdVar5->m_prev->m_incidentFace = HVar3;
    return true;
  }
  return false;
}

Assistant:

bool dgPolyhedra::FlipEdge (dgEdge* const edge)
{
	//	dgTreeNode *node;
	if (edge->m_next->m_next->m_next != edge) {
		return false;
	}

	if (edge->m_twin->m_next->m_next->m_next != edge->m_twin) {
		return false;
	}

	if (FindEdge(edge->m_prev->m_incidentVertex, edge->m_twin->m_prev->m_incidentVertex)) {
		return false;
	}

	dgEdge *const prevEdge = edge->m_prev;
	dgEdge *const prevTwin = edge->m_twin->m_prev;

	dgPairKey edgeKey (prevTwin->m_incidentVertex, prevEdge->m_incidentVertex);
	dgPairKey twinKey (prevEdge->m_incidentVertex, prevTwin->m_incidentVertex);

	ReplaceKey (GetNodeFromInfo (*edge), edgeKey.GetVal());
	//	HACD_ASSERT (node);

	ReplaceKey (GetNodeFromInfo (*edge->m_twin), twinKey.GetVal());
	//	HACD_ASSERT (node);

	edge->m_incidentVertex = prevTwin->m_incidentVertex;
	edge->m_twin->m_incidentVertex = prevEdge->m_incidentVertex;

	edge->m_userData = prevTwin->m_userData;
	edge->m_twin->m_userData = prevEdge->m_userData;

	prevEdge->m_next = edge->m_twin->m_next;
	prevTwin->m_prev->m_prev = edge->m_prev;

	prevTwin->m_next = edge->m_next;
	prevEdge->m_prev->m_prev = edge->m_twin->m_prev;

	edge->m_prev = prevTwin->m_prev;
	edge->m_next = prevEdge;

	edge->m_twin->m_prev = prevEdge->m_prev;
	edge->m_twin->m_next = prevTwin;

	prevTwin->m_prev->m_next = edge;
	prevTwin->m_prev = edge->m_twin;

	prevEdge->m_prev->m_next = edge->m_twin;
	prevEdge->m_prev = edge;

	edge->m_next->m_incidentFace = edge->m_incidentFace;
	edge->m_prev->m_incidentFace = edge->m_incidentFace;

	edge->m_twin->m_next->m_incidentFace = edge->m_twin->m_incidentFace;
	edge->m_twin->m_prev->m_incidentFace = edge->m_twin->m_incidentFace;


#ifdef __ENABLE_SANITY_CHECK 
	HACD_ASSERT (SanityCheck ());
#endif

	return true;
}